

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O1

int archive_compressor_xz_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict6 *data;
  uint32_t uVar1;
  int iVar2;
  
  data = (private_data_conflict6 *)f->data;
  data->total_in = data->total_in + length;
  if (f->code == 9) {
    uVar1 = lzma_crc32(buff,length,data->crc32);
    data->crc32 = uVar1;
  }
  (data->stream).next_in = (uint8_t *)buff;
  (data->stream).avail_in = length;
  iVar2 = drive_compressor(f,data,0);
  return iVar2;
}

Assistant:

static int
archive_compressor_xz_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->total_in += length;
	if (f->code == ARCHIVE_FILTER_LZIP)
		data->crc32 = lzma_crc32(buff, length, data->crc32);

	/* Compress input data to output buffer */
	data->stream.next_in = buff;
	data->stream.avail_in = length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}